

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

RegexMatcher * __thiscall icu_63::RegexMatcher::useTransparentBounds(RegexMatcher *this,UBool b)

{
  int64_t iVar1;
  int64_t *piVar2;
  
  this->fTransparentBounds = b;
  iVar1 = 0;
  if (b == '\0') {
    iVar1 = this->fRegionStart;
  }
  piVar2 = &this->fInputLength;
  if (b == '\0') {
    piVar2 = &this->fRegionLimit;
  }
  this->fLookStart = iVar1;
  this->fLookLimit = *piVar2;
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::useTransparentBounds(UBool b) {
    fTransparentBounds = b;
    fLookStart = (fTransparentBounds ? 0 : fRegionStart);
    fLookLimit = (fTransparentBounds ? fInputLength : fRegionLimit);
    return *this;
}